

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

UBool __thiscall
icu_63::CollationDataBuilder::getJamoCE32s
          (CollationDataBuilder *this,uint32_t *jamoCE32s,UErrorCode *errorCode)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t ce32;
  uint32_t uVar4;
  uint c;
  uint uVar5;
  int32_t j;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  uVar5 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    bVar8 = this->base == (CollationData *)0x0;
    uVar6 = 0;
    bVar7 = false;
    bVar2 = false;
    do {
      if (uVar6 < 0x13) {
        c = (int)uVar6 + 0x1100;
      }
      else if (uVar6 < 0x28) {
        c = uVar5 + 0x114e;
      }
      else {
        c = uVar5 | 0x1180;
      }
      uVar3 = utrie2_get32_63(this->trie,c);
      uVar4 = uVar3;
      ce32 = uVar3;
      if (uVar3 == 0xc0) {
        ce32 = CollationData::getCE32(this->base,c);
        uVar4 = 0xc0;
      }
      if ((~ce32 & 0xc0) != 0) {
switchD_00234144_caseD_1:
        uVar4 = ce32;
        goto LAB_0023417d;
      }
      switch(ce32 & 0xf) {
      case 0:
      case 3:
      case 7:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
        *errorCode = U_INTERNAL_PROGRAM_ERROR;
        bVar1 = false;
        goto LAB_00234188;
      default:
        goto switchD_00234144_caseD_1;
      case 5:
      case 6:
      case 8:
      case 9:
        if (uVar3 == 0xc0) {
          bVar2 = true;
        }
        break;
      case 0xe:
        uVar4 = getCE32FromOffsetCE32(this,uVar3 == 0xc0,c,ce32);
        break;
      case 0xf:
        uVar4 = 0xc0;
        bVar2 = true;
      }
LAB_0023417d:
      jamoCE32s[uVar6] = uVar4;
      bVar1 = true;
LAB_00234188:
      bVar8 = (bool)(bVar8 | (uVar3 != 0xc0 && uVar3 != 0xffffffff));
      if (!bVar1) break;
      uVar5 = uVar5 + 1;
      bVar7 = 0x41 < uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x43);
    if (bVar7) {
      if ((bVar8) && (bVar2)) {
        uVar6 = 0;
        do {
          if (jamoCE32s[uVar6] == 0xc0) {
            uVar5 = (uint)uVar6;
            if (uVar6 < 0x13) {
              uVar5 = uVar5 + 0x1100;
            }
            else if (uVar6 < 0x28) {
              uVar5 = uVar5 + 0x114e;
            }
            else {
              uVar5 = uVar5 | 0x1180;
            }
            uVar4 = CollationData::getCE32(this->base,uVar5);
            uVar4 = copyFromBaseCE32(this,uVar5,uVar4,'\x01',errorCode);
            jamoCE32s[uVar6] = uVar4;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != 0x43);
      }
      if (bVar8) {
        uVar5 = (uint)(*errorCode < U_ILLEGAL_ARGUMENT_ERROR);
        goto LAB_0023426c;
      }
    }
    uVar5 = 0;
  }
LAB_0023426c:
  return (UBool)uVar5;
}

Assistant:

UBool
CollationDataBuilder::getJamoCE32s(uint32_t jamoCE32s[], UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    UBool anyJamoAssigned = base == NULL;  // always set jamoCE32s in the base data
    UBool needToCopyFromBase = FALSE;
    for(int32_t j = 0; j < CollationData::JAMO_CE32S_LENGTH; ++j) {  // Count across Jamo types.
        UChar32 jamo = jamoCpFromIndex(j);
        UBool fromBase = FALSE;
        uint32_t ce32 = utrie2_get32(trie, jamo);
        anyJamoAssigned |= Collation::isAssignedCE32(ce32);
        // TODO: Try to prevent [optimize [Jamo]] from counting as anyJamoAssigned.
        // (As of CLDR 24 [2013] the Korean tailoring does not optimize conjoining Jamo.)
        if(ce32 == Collation::FALLBACK_CE32) {
            fromBase = TRUE;
            ce32 = base->getCE32(jamo);
        }
        if(Collation::isSpecialCE32(ce32)) {
            switch(Collation::tagFromCE32(ce32)) {
            case Collation::LONG_PRIMARY_TAG:
            case Collation::LONG_SECONDARY_TAG:
            case Collation::LATIN_EXPANSION_TAG:
                // Copy the ce32 as-is.
                break;
            case Collation::EXPANSION32_TAG:
            case Collation::EXPANSION_TAG:
            case Collation::PREFIX_TAG:
            case Collation::CONTRACTION_TAG:
                if(fromBase) {
                    // Defer copying until we know if anyJamoAssigned.
                    ce32 = Collation::FALLBACK_CE32;
                    needToCopyFromBase = TRUE;
                }
                break;
            case Collation::IMPLICIT_TAG:
                // An unassigned Jamo should only occur in tests with incomplete bases.
                U_ASSERT(fromBase);
                ce32 = Collation::FALLBACK_CE32;
                needToCopyFromBase = TRUE;
                break;
            case Collation::OFFSET_TAG:
                ce32 = getCE32FromOffsetCE32(fromBase, jamo, ce32);
                break;
            case Collation::FALLBACK_TAG:
            case Collation::RESERVED_TAG_3:
            case Collation::BUILDER_DATA_TAG:
            case Collation::DIGIT_TAG:
            case Collation::U0000_TAG:
            case Collation::HANGUL_TAG:
            case Collation::LEAD_SURROGATE_TAG:
                errorCode = U_INTERNAL_PROGRAM_ERROR;
                return FALSE;
            }
        }
        jamoCE32s[j] = ce32;
    }
    if(anyJamoAssigned && needToCopyFromBase) {
        for(int32_t j = 0; j < CollationData::JAMO_CE32S_LENGTH; ++j) {
            if(jamoCE32s[j] == Collation::FALLBACK_CE32) {
                UChar32 jamo = jamoCpFromIndex(j);
                jamoCE32s[j] = copyFromBaseCE32(jamo, base->getCE32(jamo),
                                                /*withContext=*/ TRUE, errorCode);
            }
        }
    }
    return anyJamoAssigned && U_SUCCESS(errorCode);
}